

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void assert_correct_relation_between_relops<mark_negative,ak_toolkit::markable_ns::order_by_value>
               (markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *a,
               markable<mark_negative,_ak_toolkit::markable_ns::order_by_value> *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = ak_toolkit::markable_ns::order_by_value::
          equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  bVar2 = ak_toolkit::markable_ns::order_by_value::
          equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
  if (bVar1 != bVar2) {
    __assert_fail("(a == b) == (b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fa,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::operator!=(a,b);
  bVar2 = ak_toolkit::markable_ns::operator!=(b,a);
  if (bVar1 != bVar2) {
    __assert_fail("(a != b) == (b != a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fb,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::operator!=(a,b);
  bVar2 = ak_toolkit::markable_ns::order_by_value::
          equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  if (bVar1 == bVar2) {
    __assert_fail("(a != b) == !(a == b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fc,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::operator!=(b,a);
  bVar2 = ak_toolkit::markable_ns::order_by_value::
          equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
  if (bVar1 == bVar2) {
    __assert_fail("(b != a) == !(b == a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1fd,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
          less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  bVar2 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
          less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  if (bVar1 != bVar2) {
    __assert_fail("(a < b) == (b > a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x1ff,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
          less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  bVar2 = ak_toolkit::markable_ns::operator>=(a,b);
  if (bVar1 == bVar2) {
    __assert_fail("(a < b) == !(a >= b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x200,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
          less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  bVar2 = ak_toolkit::markable_ns::operator<=(b,a);
  if (bVar1 == bVar2) {
    __assert_fail("(a < b) == !(b <= a)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x201,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  bVar1 = ak_toolkit::markable_ns::order_by_value::
          equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
  bVar2 = ak_toolkit::markable_ns::operator>=(a,b);
  bVar3 = false;
  if (bVar2) {
    bVar3 = ak_toolkit::markable_ns::operator<=(a,b);
  }
  if (bVar3 == bVar1) {
    bVar1 = ak_toolkit::markable_ns::order_by_value::
            equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
    bVar2 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
            less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
    bVar3 = false;
    if (!bVar2) {
      bVar3 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
              less<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
      bVar3 = !bVar3;
    }
    if (bVar3 != bVar1) {
      __assert_fail("(a == b) == (!(a < b) && !(a > b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x204,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    bVar1 = ak_toolkit::markable_ns::operator<=(a,b);
    bVar2 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
            less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = ak_toolkit::markable_ns::order_by_value::
              equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
    }
    if (bVar2 == bVar1) {
      bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
              less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
      bVar2 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
              less<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
      bVar3 = false;
      if (!bVar2) {
        bVar3 = ak_toolkit::markable_ns::order_by_value::
                equal<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
        bVar3 = !bVar3;
      }
      if (bVar3 == bVar1) {
        bVar1 = ak_toolkit::markable_ns::operator!=(a,b);
        bVar2 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
                less<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
        if (bVar1 != bVar2) {
          bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value
                  ::less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
          if (!bVar1) {
            __assert_fail("(a != b) == (a > b) || (b > a)",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x207,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                         );
          }
        }
        bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
                less<mark_negative,ak_toolkit::markable_ns::order_by_value>(a,b);
        if (bVar1) {
          bVar1 = ak_toolkit::markable_ns::operator!=(a,b);
          if (!bVar1) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x209,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                         );
          }
        }
        bVar1 = ((({parm#1}.value)())<(({parm#2}.value)()))ak_toolkit::markable_ns::order_by_value::
                less<mark_negative,ak_toolkit::markable_ns::order_by_value>(b,a);
        if (bVar1) {
          bVar1 = ak_toolkit::markable_ns::operator!=(a,b);
          if (!bVar1) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                          ,0x20a,
                          "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                         );
          }
        }
        return;
      }
      __assert_fail("(a < b) == (!(a > b) && !(a == b))",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x206,
                    "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                   );
    }
    __assert_fail("(a <= b) == ((a < b) || (a == b))",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x205,
                  "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
                 );
  }
  __assert_fail("(a == b) == (a >= b && a <= b)",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x203,
                "void assert_correct_relation_between_relops(const markable<MP, OP> &, const markable<MP, OP> &) [MP = mark_negative, OP = ak_toolkit::markable_ns::order_by_value]"
               );
}

Assistant:

void assert_correct_relation_between_relops
  (markable<MP, OP> const& a, markable<MP, OP> const& b)
{
  assert( (a == b) ==  (b == a) );
  assert( (a != b) ==  (b != a) );
  assert( (a != b) == !(a == b) );
  assert( (b != a) == !(b == a) );

  assert( (a < b) == (b > a) );
  assert( (a < b) == !(a >= b) );
  assert( (a < b) == !(b <= a) );

  assert( (a == b) == (a >= b && a <= b) );
  assert( (a == b) == (!(a < b) && !(a > b)) );
  assert( (a <= b) == ((a < b) || (a == b)) );
  assert( (a < b) == (!(a > b) && !(a == b)) );
  assert( (a != b) == (a > b) || (b > a) );

  if (a < b) assert(a != b);
  if (a > b) assert(a != b);
}